

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_curse(parser *p)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  char **ppcVar8;
  parser_error pVar9;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"name");
  wVar2 = parser_getint(p,"power");
  if (pvVar4 == (void *)0x0) {
    pVar9 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    bVar1 = z_info->curse_max;
    uVar6 = 1;
    if (1 < bVar1) {
      ppcVar8 = &curses[1].name;
      uVar7 = 1;
      do {
        iVar3 = strcmp(__s1,*ppcVar8);
        if (iVar3 == 0) goto LAB_00189153;
        uVar7 = uVar7 + 1;
        ppcVar8 = ppcVar8 + 7;
      } while ((uint)bVar1 != uVar7);
      uVar7 = (ulong)(uint)bVar1;
LAB_00189153:
      uVar6 = (uint)uVar7;
    }
    pVar9 = PARSE_ERROR_UNRECOGNISED_CURSE;
    if (uVar6 != bVar1) {
      pVar9 = PARSE_ERROR_NONE;
      if (L'\0' < wVar2) {
        if (*(long *)((long)pvVar4 + 0x108) == 0) {
          pvVar5 = mem_zalloc((ulong)bVar1 << 2);
          *(void **)((long)pvVar4 + 0x108) = pvVar5;
        }
        *(wchar_t *)(*(long *)((long)pvVar4 + 0x108) + (ulong)uVar6 * 4) = wVar2;
        pVar9 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar9;
}

Assistant:

static enum parser_error parse_artifact_curse(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *s = parser_getsym(p, "name");
	int power = parser_getint(p, "power");
	int i;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->curse_max; i++) {
		if (streq(s, curses[i].name)) break;
	}
	if (i == z_info->curse_max) {
		return PARSE_ERROR_UNRECOGNISED_CURSE;
	}
	/* Only add if it has power. */
	if (power > 0) {
		if (!a->curses) {
			a->curses = mem_zalloc(z_info->curse_max * sizeof(int));
		}
		a->curses[i] = power;
	}
	return PARSE_ERROR_NONE;
}